

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcpLight.c
# Opt level: O1

void XcpLight_processCommand(XcpLightMessage_t *msg)

{
  uint8_t uVar1;
  uint8_t auVar2 [8];
  undefined6 uVar3;
  _Bool _Var4;
  byte bVar5;
  uint uVar6;
  uint8_t uVar7;
  ulong uVar8;
  ulong uVar9;
  
  auVar2 = XcpLight_self.cto_reply_msg.payload;
  XcpLight_self.cto_cmd_msg.payload._4_4_ = *(undefined4 *)(msg->payload + 4);
  XcpLight_self.cto_cmd_msg.length = msg->length;
  XcpLight_self.cto_cmd_msg.payload[0] = msg->payload[0];
  XcpLight_self.cto_cmd_msg.payload[1] = msg->payload[1];
  XcpLight_self.cto_cmd_msg.payload[2] = msg->payload[2];
  XcpLight_self.cto_cmd_msg.payload[3] = msg->payload[3];
  XcpLight_self.current_command = msg->payload[0];
  if (XcpLight_self.current_command == 0xff) {
    XcpLight_self.cto_reply_msg.length = 8;
    XcpLight_self.cto_reply_msg.payload[0] = 0xff;
    XcpLight_self.cto_reply_msg.payload[1] = '\x01';
    XcpLight_self.cto_reply_msg.payload[2] = 0x80;
    XcpLight_self.cto_reply_msg.payload[3] = '\b';
    XcpLight_self.cto_reply_msg.payload[4] = '\b';
    XcpLight_self.cto_reply_msg.payload[5] = '\0';
    XcpLight_self.cto_reply_msg.payload[6] = '\x01';
    XcpLight_self.cto_reply_msg.payload[7] = '\x01';
    XcpLight_self.session_status = XcpLight_self.session_status | 2;
    XcpLight_self.protection_status = 0xff;
    goto LAB_001024b1;
  }
  if ((XcpLight_self._36_2_ & 2) == 0) {
    XcpLight_self.cto_cmd_msg.payload[4] = XcpLight_self.cto_cmd_msg.payload[4];
    XcpLight_self.cto_cmd_msg.payload[5] = XcpLight_self.cto_cmd_msg.payload[5];
    XcpLight_self.cto_cmd_msg.payload[6] = XcpLight_self.cto_cmd_msg.payload[6];
    XcpLight_self.cto_cmd_msg.payload[7] = XcpLight_self.cto_cmd_msg.payload[7];
    return;
  }
  uVar3 = XcpLight_self.cto_reply_msg.payload._2_6_;
  switch(XcpLight_self.current_command) {
  case 0xf0:
    if ((XcpLight_self._36_2_ & 0x100) != 0) {
LAB_00102883:
      XcpLight_self.cto_reply_msg.length = 2;
      XcpLight_self.cto_reply_msg.payload[0] = 0xfe;
      XcpLight_self.cto_reply_msg.payload[1] = '%';
      break;
    }
    bVar5 = msg->payload[1];
    if (6 < bVar5) goto LAB_0010268d;
    XcpLightCfg_writeToAddress((uint8_t *)XcpLight_self.mta,bVar5,msg->payload + 2);
    XcpLight_self.mta = (void *)(ulong)((uint)bVar5 + (int)XcpLight_self.mta);
    goto LAB_00102575;
  case 0xf1:
    _Var4 = XcpLightCfg_processUserCommand(msg,&XcpLight_self.cto_reply_msg);
    if (!_Var4) {
      return;
    }
    break;
  default:
    XcpLight_self.cto_reply_msg.length = 2;
    XcpLight_self.cto_reply_msg.payload[0] = 0xfe;
    XcpLight_self.cto_reply_msg.payload[1] = ' ';
    XcpLight_self.cto_reply_msg.payload =
         (uint8_t  [8])CONCAT62(uVar3,XcpLight_self.cto_reply_msg.payload._0_2_);
    break;
  case 0xf4:
    bVar5 = msg->payload[1];
    if (bVar5 < 7) {
      XcpLight_self.cto_reply_msg.length = bVar5 + 1;
      XcpLight_self.cto_reply_msg.payload[0] = 0xff;
      XcpLight_self.mta = XcpLightCfg_getPointer(*(uint32_t *)(msg->payload + 4),msg->payload[3]);
LAB_00102674:
      XcpLightCfg_readFromAddress
                ((uint8_t *)XcpLight_self.mta,bVar5,XcpLight_self.cto_reply_msg.payload + 1);
      XcpLight_self.mta = (void *)(ulong)((uint)bVar5 + (int)XcpLight_self.mta);
      break;
    }
    goto LAB_0010268d;
  case 0xf5:
    bVar5 = msg->payload[1];
    if (bVar5 < 7) {
      XcpLight_self.cto_reply_msg.length = bVar5 + 1;
      XcpLight_self.cto_reply_msg.payload[0] = 0xff;
      goto LAB_00102674;
    }
    goto LAB_0010268d;
  case 0xf6:
    XcpLight_self.cto_reply_msg.length = 2;
    XcpLight_self.cto_reply_msg.payload[0] = 0xff;
    XcpLight_self.cto_reply_msg.payload[1] = '\0';
    XcpLight_self.cto_reply_msg.payload =
         (uint8_t  [8])CONCAT62(uVar3,XcpLight_self.cto_reply_msg.payload._0_2_);
    XcpLight_self.mta = XcpLightCfg_getPointer(*(uint32_t *)(msg->payload + 4),msg->payload[3]);
    break;
  case 0xf7:
    bVar5 = msg->payload[1];
    if (bVar5 < 0xb) {
      if (bVar5 == 0) {
        uVar6 = msg->length + 0xfe & 0xff;
        if (uVar6 != 0) {
          uVar8 = 0;
          do {
            uVar9 = (ulong)XcpLight_self.key_index;
            XcpLight_self.key_index = XcpLight_self.key_index + '\x01';
            XcpLight_self.key[uVar9] = msg->payload[uVar8 + 2];
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
      }
      else {
        uVar6 = 6;
        if (bVar5 < 6) {
          uVar6 = (uint)bVar5;
        }
        uVar8 = 0;
        do {
          uVar9 = (ulong)XcpLight_self.key_index;
          XcpLight_self.key_index = XcpLight_self.key_index + '\x01';
          XcpLight_self.key[uVar9] = msg->payload[uVar8 + 2];
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        if (6 < bVar5) break;
      }
      _Var4 = XcpLightCfg_unlockResource((uint)XcpLight_self.unlock_resource,XcpLight_self.key);
      XcpLight_self.key_index = '\0';
      if (_Var4) {
        bVar5 = ~XcpLight_self.unlock_resource & XcpLight_self.protection_status;
        XcpLight_self.protection_status = bVar5;
        XcpLight_self.cto_reply_msg.length = 2;
        XcpLight_self.cto_reply_msg.payload[1] = bVar5;
        XcpLight_self.cto_reply_msg.payload[0] = 0xff;
        break;
      }
      goto LAB_00102883;
    }
    XcpLight_self.key_index = '\0';
LAB_0010268d:
    XcpLight_self.cto_reply_msg.length = 2;
    XcpLight_self.cto_reply_msg.payload[0] = 0xfe;
    XcpLight_self.cto_reply_msg.payload[1] = '\"';
    XcpLight_self.cto_reply_msg.payload =
         (uint8_t  [8])CONCAT62(uVar3,XcpLight_self.cto_reply_msg.payload._0_2_);
    break;
  case 0xf8:
    uVar1 = msg->payload[1];
    if (uVar1 == '\0') {
      XcpLight_self.seed_index = '\0';
      XcpLight_self.unlock_resource = msg->payload[2];
      if ((XcpLight_self.protection_status & XcpLight_self.unlock_resource) == 0) {
        XcpLight_self.cto_reply_msg.length = 2;
        XcpLight_self.cto_reply_msg.payload =
             (uint8_t  [8])((ulong)(uint7)XcpLight_self.cto_reply_msg.payload._1_7_ << 8);
        break;
      }
      XcpLightCfg_getSeed((uint)XcpLight_self.unlock_resource,XcpLight_self.seed);
      XcpLight_self.remaining_seed_bytes = '\n';
    }
    else if (XcpLight_self.remaining_seed_bytes == '\0') {
      XcpLight_self.seed_index = '\0';
      XcpLight_self.cto_reply_msg.length = 2;
      XcpLight_self.cto_reply_msg.payload[0] = 0xfe;
      XcpLight_self.cto_reply_msg.payload[1] = ')';
      XcpLight_self.cto_reply_msg.payload =
           (uint8_t  [8])CONCAT62(uVar3,XcpLight_self.cto_reply_msg.payload._0_2_);
      break;
    }
    uVar6 = (uint)XcpLight_self.remaining_seed_bytes;
    uVar7 = '\n';
    if (uVar1 != '\0') {
      uVar7 = XcpLight_self.remaining_seed_bytes;
    }
    XcpLight_self.cto_reply_msg.payload[1] = uVar7;
    XcpLight_self.cto_reply_msg.payload[0] = 0xff;
    if (uVar6 < 7) {
      XcpLight_self.cto_reply_msg.length = uVar6 + 2;
      XcpLight_self.remaining_seed_bytes = '\0';
    }
    else {
      XcpLight_self.cto_reply_msg.length = 8;
      XcpLight_self.remaining_seed_bytes = XcpLight_self.remaining_seed_bytes + 0xfa;
      uVar6 = 6;
    }
    if (uVar6 != 0) {
      uVar8 = 0;
      do {
        uVar9 = (ulong)XcpLight_self.seed_index;
        XcpLight_self.seed_index = XcpLight_self.seed_index + '\x01';
        XcpLight_self.cto_reply_msg.payload[uVar8 + 2] = XcpLight_self.seed[uVar9];
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
    break;
  case 0xfb:
    XcpLight_self.cto_reply_msg.length = 8;
    XcpLight_self.cto_reply_msg.payload[0] = 0xff;
    XcpLight_self.cto_reply_msg.payload[1] = '\0';
    XcpLight_self.cto_reply_msg.payload[2] = '\0';
    XcpLight_self.cto_reply_msg.payload[3] = '\0';
    XcpLight_self.cto_reply_msg.payload[4] = '\0';
    XcpLight_self.cto_reply_msg.payload[5] = '\0';
    XcpLight_self.cto_reply_msg.payload[6] = '\0';
    XcpLight_self.cto_reply_msg.payload[7] = '\x01';
    break;
  case 0xfc:
    XcpLight_self.cto_reply_msg.length = 2;
    XcpLight_self.cto_reply_msg.payload[0] = 0xfe;
    XcpLight_self.cto_reply_msg.payload[1] = '\0';
    XcpLight_self.cto_reply_msg.payload =
         (uint8_t  [8])CONCAT62(uVar3,XcpLight_self.cto_reply_msg.payload._0_2_);
    break;
  case 0xfd:
    XcpLight_self.cto_reply_msg.length = 6;
    XcpLight_self.cto_reply_msg.payload[1] = XcpLight_self.session_status;
    XcpLight_self.cto_reply_msg.payload[0] = 0xff;
    XcpLight_self.cto_reply_msg.payload[2] = XcpLight_self.protection_status;
    XcpLight_self.cto_reply_msg.payload._6_2_ = auVar2._6_2_;
    XcpLight_self.cto_reply_msg.payload[3] = '\0';
    XcpLight_self.cto_reply_msg.payload[4] = '\0';
    XcpLight_self.cto_reply_msg.payload[5] = '\0';
    break;
  case 0xfe:
    XcpLight_self.session_status = '\0';
    XcpLight_self.protection_status = 0xff;
LAB_00102575:
    XcpLight_self.cto_reply_msg.length = 1;
    XcpLight_self.cto_reply_msg.payload[0] = 0xff;
  }
LAB_001024b1:
  XcpLightCfg_sendMessage(&XcpLight_self.cto_reply_msg);
  return;
}

Assistant:

void XcpLight_processCommand(XcpLightMessage_t *msg)
{
  XcpLightMessage_t *reply_msg = &(XcpLight_self.cto_reply_msg);

#ifdef XCPLIGHT_CFG_DEBUG_CMD_MSG
  XcpLight_self.cto_cmd_msg = *msg; // copy to internal state (for ext. debugging)
#endif

  bool send_flag = false;

  XcpLight_self.current_command = (msg->payload[0] & 0xFFu);

  if (XcpLight_self.current_command == XCP_CMD_CONNECT)
  {
    // STD : standard commands :: connect begin
    send_flag = cmdConnect(msg, reply_msg);
    // STD : standard commands :: connect end
  }
  else
  {
    if (XcpLight_self.session_status & XCP_SES_CONNECTED)
    {
      // in connected state process all other commands
      switch (XcpLight_self.current_command)
      {
        // STD : standard commands -> begin
        case XCP_CMD_DISCONNECT:
          send_flag = cmdDisconnect(msg, reply_msg);
          break;

        case XCP_CMD_GET_STATUS:
          send_flag = cmdGetStatus(msg, reply_msg);
          break;

        case XCP_CMD_SYNCH:
          send_flag = cmdSynch(msg, reply_msg);
          break;

        case XCP_CMD_GET_COMM_MODE_INFO:
          send_flag = cmdGetCommModeInfo(msg, reply_msg);
          break;

#ifdef XCPLIGHT_CFG_SEED_AND_KEY
        case XCP_CMD_GET_SEED:
          send_flag = cmdGetSeed(msg, reply_msg);
          break;

        case XCP_CMD_UNLOCK:
          send_flag = cmdUnlock(msg, reply_msg);
          break;
#endif // XCPLIGHT_CFG_SEED_AND_KEY

#ifdef XCPLIGHT_CFG_USER_CMD
        case XCP_CMD_USER_CMD:
          send_flag = cmdUserCmd(msg, reply_msg);
          break;
#endif // XCPLIGHT_CFG_USER_CMD

        case XCP_CMD_SET_MTA:
          send_flag = cmdSetMta(msg, reply_msg);
          break;

        case XCP_CMD_UPLOAD:
          send_flag = cmdUpload(msg, reply_msg);
          break;

        case XCP_CMD_SHORT_UPLOAD:
          send_flag = cmdShortUpload(msg, reply_msg);
          break;

        case XCP_CMD_BUILD_CHECKSUM:
          send_flag = buildErrorMessage(reply_msg, XCP_ERR_CMD_UNKNOWN);
          break;
        // STD : standard commands -> end

#ifdef XCPLIGHT_CFG_ENABLE_CALPAG
        // CAL : standard commands -> begin
        case XCP_CMD_DOWNLOAD:
          send_flag = cmdDownload(msg, reply_msg);
          break;
        // CAL : standard commands -> end

        // PAG: page switching commands -> begin
        case XCP_CMD_SET_CAL_PAGE:
        case XCP_CMD_GET_CAL_PAGE:
        // PAG: page switching commands -> end
#endif // XCPLIGHT_CFG_ENABLE_CALPAG

#ifdef XCPLIGHT_CFG_ENABLE_DAQ
        // DAQ: data acquisition commands -> begin
        // @note: not supported yet
        // DAQ: data acquisition commands -> end
#endif // XCPLIGHT_CFG_ENABLE_DAQ

#ifdef XCPLIGHT_CFG_ENABLE_PGM
        // PGM: programming commands -> begin
        // @note: not supported yet
        case XCP_CMD_PROGRAM_START:
        case XCP_CMD_PROGRAM_CLEAR:
        case XCP_CMD_PROGRAM:
        case XCP_CMD_PROGRAM_RESET:

        case XCP_CMD_PROGRAM_MAX:
        case XCP_CMD_PROGRAM_VERIFY:
          send_flag = buildErrorMessage(reply_msg, XCP_ERR_CMD_UNKNOWN);
          break;
        // PGM: programming commands -> end
#endif // XCPLIGHT_CFG_ENABLE_PGM

        // Whenever a command is unknown -> build and send an error message
        default:
          send_flag = buildErrorMessage(reply_msg, XCP_ERR_CMD_UNKNOWN);
          break;
      }
    }
    else
    {
      // no XCP communication in disconnected state! ignore command.
    }
  }

  // send reply message
  if (send_flag == true)
  {
    XcpLightCfg_sendMessage(reply_msg);
  }
}